

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderImageSizeTests.cpp
# Opt level: O2

string * __thiscall
gl4cts::(anonymous_namespace)::ImageSizeMachine::GenShader<tcu::Vector<int,4>>
          (string *__return_storage_ptr__,ImageSizeMachine *this,int stage,bool ms_and_1d,
          bool subroutine)

{
  ostream *poVar1;
  char *pcVar2;
  uint uVar3;
  ostringstream os;
  string local_360 [32];
  string local_340 [32];
  string local_320 [32];
  string local_300 [32];
  string local_2e0 [32];
  string local_2c0 [32];
  string local_2a0 [32];
  string local_280 [32];
  string local_260 [32];
  string local_240 [32];
  string local_220 [32];
  string local_200 [32];
  string local_1e0 [32];
  string local_1c0 [32];
  ostream local_1a0;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a0);
  std::operator<<(&local_1a0,"#version 430 core");
  uVar3 = (uint)this;
  if (uVar3 == 4) {
    std::operator<<(&local_1a0,"\n#extension GL_ARB_compute_shader : require");
  }
  std::operator<<(&local_1a0,"\nlayout(binding = 0, rgba32i) writeonly uniform iimage2D g_result;");
  if ((char)stage == '\0') {
    poVar1 = std::operator<<(&local_1a0,"\nlayout(binding = 1, rgba32");
    ImageFormatPostfix<tcu::Vector<int,4>>();
    poVar1 = std::operator<<(poVar1,local_280);
    poVar1 = std::operator<<(poVar1,") uniform ");
    ImageTypePrefix<tcu::Vector<int,4>>();
    poVar1 = std::operator<<(poVar1,local_2a0);
    poVar1 = std::operator<<(poVar1,"image2D g_image_2d;\nlayout(binding = 2, rgba32");
    ImageFormatPostfix<tcu::Vector<int,4>>();
    poVar1 = std::operator<<(poVar1,local_2c0);
    poVar1 = std::operator<<(poVar1,") uniform ");
    ImageTypePrefix<tcu::Vector<int,4>>();
    poVar1 = std::operator<<(poVar1,local_2e0);
    poVar1 = std::operator<<(poVar1,"image3D g_image_3d;\nlayout(binding = 3, rgba32");
    ImageFormatPostfix<tcu::Vector<int,4>>();
    poVar1 = std::operator<<(poVar1,local_300);
    poVar1 = std::operator<<(poVar1,") uniform ");
    ImageTypePrefix<tcu::Vector<int,4>>();
    poVar1 = std::operator<<(poVar1,local_320);
    poVar1 = std::operator<<(poVar1,"imageCube g_image_cube;\nlayout(binding = 4, rgba32");
    ImageFormatPostfix<tcu::Vector<int,4>>();
    poVar1 = std::operator<<(poVar1,local_340);
    poVar1 = std::operator<<(poVar1,") uniform ");
    ImageTypePrefix<tcu::Vector<int,4>>();
    poVar1 = std::operator<<(poVar1,local_360);
    poVar1 = std::operator<<(poVar1,"imageCubeArray g_image_cube_array;\nlayout(binding = 5, rgba32"
                            );
    ImageFormatPostfix<tcu::Vector<int,4>>();
    poVar1 = std::operator<<(poVar1,local_1c0);
    poVar1 = std::operator<<(poVar1,") uniform ");
    ImageTypePrefix<tcu::Vector<int,4>>();
    poVar1 = std::operator<<(poVar1,local_1e0);
    poVar1 = std::operator<<(poVar1,"image2DRect g_image_rect;\nlayout(binding = 6, rgba32");
    ImageFormatPostfix<tcu::Vector<int,4>>();
    poVar1 = std::operator<<(poVar1,local_200);
    poVar1 = std::operator<<(poVar1,") uniform ");
    ImageTypePrefix<tcu::Vector<int,4>>();
    poVar1 = std::operator<<(poVar1,local_220);
    poVar1 = std::operator<<(poVar1,"image2DArray g_image_2d_array;\nlayout(binding = 7, rgba32");
    ImageFormatPostfix<tcu::Vector<int,4>>();
    poVar1 = std::operator<<(poVar1,local_240);
    poVar1 = std::operator<<(poVar1,") uniform ");
    ImageTypePrefix<tcu::Vector<int,4>>();
    poVar1 = std::operator<<(poVar1,local_260);
    std::operator<<(poVar1,"imageBuffer g_image_buffer;");
    std::__cxx11::string::~string(local_260);
    std::__cxx11::string::~string(local_240);
    std::__cxx11::string::~string(local_220);
    std::__cxx11::string::~string(local_200);
    std::__cxx11::string::~string(local_1e0);
    std::__cxx11::string::~string(local_1c0);
  }
  else {
    poVar1 = std::operator<<(&local_1a0,"\nlayout(binding = 1, rgba32");
    ImageFormatPostfix<tcu::Vector<int,4>>();
    poVar1 = std::operator<<(poVar1,local_280);
    poVar1 = std::operator<<(poVar1,") uniform ");
    ImageTypePrefix<tcu::Vector<int,4>>();
    poVar1 = std::operator<<(poVar1,local_2a0);
    poVar1 = std::operator<<(poVar1,"image1D g_image_1d;\nlayout(binding = 2, rgba32");
    ImageFormatPostfix<tcu::Vector<int,4>>();
    poVar1 = std::operator<<(poVar1,local_2c0);
    poVar1 = std::operator<<(poVar1,") uniform ");
    ImageTypePrefix<tcu::Vector<int,4>>();
    poVar1 = std::operator<<(poVar1,local_2e0);
    poVar1 = std::operator<<(poVar1,"image1DArray g_image_1d_array;\nlayout(binding = 3, rgba32");
    ImageFormatPostfix<tcu::Vector<int,4>>();
    poVar1 = std::operator<<(poVar1,local_300);
    poVar1 = std::operator<<(poVar1,") uniform ");
    ImageTypePrefix<tcu::Vector<int,4>>();
    poVar1 = std::operator<<(poVar1,local_320);
    poVar1 = std::operator<<(poVar1,"image2DMS g_image_2dms;\nlayout(binding = 4, rgba32");
    ImageFormatPostfix<tcu::Vector<int,4>>();
    poVar1 = std::operator<<(poVar1,local_340);
    poVar1 = std::operator<<(poVar1,") uniform ");
    ImageTypePrefix<tcu::Vector<int,4>>();
    poVar1 = std::operator<<(poVar1,local_360);
    std::operator<<(poVar1,"image2DMSArray g_image_2dms_array;");
  }
  std::__cxx11::string::~string(local_360);
  std::__cxx11::string::~string(local_340);
  std::__cxx11::string::~string(local_320);
  std::__cxx11::string::~string(local_300);
  std::__cxx11::string::~string(local_2e0);
  std::__cxx11::string::~string(local_2c0);
  std::__cxx11::string::~string(local_2a0);
  std::__cxx11::string::~string(local_280);
  if (ms_and_1d) {
    std::operator<<(&local_1a0,
                    "\nsubroutine void FuncType(int coord);\nsubroutine uniform FuncType g_func;");
  }
  if (uVar3 < 4) {
    pcVar2 = (&PTR_anon_var_dwarf_3e1b68_01dda010)[(ulong)this & 0xffffffff];
  }
  else if (uVar3 == 4) {
    pcVar2 = 
    "\nlayout(local_size_x = 1) in;\nvoid main() {\n  int coord = int(gl_GlobalInvocationID.x);";
  }
  else {
    if (uVar3 != 5) goto LAB_00a929ab;
    pcVar2 = "\nvoid main() {\n  int coord = gl_PrimitiveID;";
  }
  std::operator<<(&local_1a0,pcVar2);
LAB_00a929ab:
  if (ms_and_1d) {
    std::operator<<(&local_1a0,"\n  g_func(coord);\n}\nsubroutine(FuncType) void Func0(int coord) {"
                   );
  }
  pcVar2 = 
  "\n  imageStore(g_result, ivec2(coord, 0), ivec4(imageSize(g_image_2d), 0, 0));\n  imageStore(g_result, ivec2(coord, 1), ivec4(imageSize(g_image_3d), 0));\n  imageStore(g_result, ivec2(coord, 2), ivec4(imageSize(g_image_cube), 0, 0));\n  imageStore(g_result, ivec2(coord, 3), ivec4(imageSize(g_image_cube_array), 0));\n  imageStore(g_result, ivec2(coord, 4), ivec4(imageSize(g_image_rect), 0, 0));\n  imageStore(g_result, ivec2(coord, 5), ivec4(imageSize(g_image_2d_array), 0));\n  imageStore(g_result, ivec2(coord, 6), ivec4(imageSize(g_image_buffer), 0, 0, 0));\n}"
  ;
  if ((char)stage != '\0') {
    pcVar2 = 
    "\n  imageStore(g_result, ivec2(coord, 0), ivec4(imageSize(g_image_1d), 0, 0, 0));\n  imageStore(g_result, ivec2(coord, 1), ivec4(imageSize(g_image_1d_array), 0, 0));\n  imageStore(g_result, ivec2(coord, 2), ivec4(imageSize(g_image_2dms), 0, 0));\n  imageStore(g_result, ivec2(coord, 3), ivec4(imageSize(g_image_2dms_array), 0));\n  imageStore(g_result, ivec2(coord, 4), ivec4(0));\n  imageStore(g_result, ivec2(coord, 5), ivec4(0));\n  imageStore(g_result, ivec2(coord, 6), ivec4(0));\n}"
    ;
  }
  std::operator<<(&local_1a0,pcVar2);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a0);
  return __return_storage_ptr__;
}

Assistant:

std::string GenShader(int stage, bool ms_and_1d, bool subroutine)
	{
		std::ostringstream os;
		os << "#version 430 core";
		if (stage == 4)
		{ // CS
			os << NL "#extension GL_ARB_compute_shader : require";
		}
		os << NL "layout(binding = 0, rgba32i) writeonly uniform iimage2D g_result;";
		if (ms_and_1d == false)
		{
			os << NL "layout(binding = 1, rgba32" << ImageFormatPostfix<T>() << ") uniform " << ImageTypePrefix<T>()
			   << "image2D g_image_2d;" NL "layout(binding = 2, rgba32" << ImageFormatPostfix<T>() << ") uniform "
			   << ImageTypePrefix<T>() << "image3D g_image_3d;" NL "layout(binding = 3, rgba32"
			   << ImageFormatPostfix<T>() << ") uniform " << ImageTypePrefix<T>()
			   << "imageCube g_image_cube;" NL "layout(binding = 4, rgba32" << ImageFormatPostfix<T>() << ") uniform "
			   << ImageTypePrefix<T>() << "imageCubeArray g_image_cube_array;" NL "layout(binding = 5, rgba32"
			   << ImageFormatPostfix<T>() << ") uniform " << ImageTypePrefix<T>()
			   << "image2DRect g_image_rect;" NL "layout(binding = 6, rgba32" << ImageFormatPostfix<T>() << ") uniform "
			   << ImageTypePrefix<T>() << "image2DArray g_image_2d_array;" NL "layout(binding = 7, rgba32"
			   << ImageFormatPostfix<T>() << ") uniform " << ImageTypePrefix<T>() << "imageBuffer g_image_buffer;";
		}
		else
		{
			os << NL "layout(binding = 1, rgba32" << ImageFormatPostfix<T>() << ") uniform " << ImageTypePrefix<T>()
			   << "image1D g_image_1d;" NL "layout(binding = 2, rgba32" << ImageFormatPostfix<T>() << ") uniform "
			   << ImageTypePrefix<T>() << "image1DArray g_image_1d_array;" NL "layout(binding = 3, rgba32"
			   << ImageFormatPostfix<T>() << ") uniform " << ImageTypePrefix<T>()
			   << "image2DMS g_image_2dms;" NL "layout(binding = 4, rgba32" << ImageFormatPostfix<T>() << ") uniform "
			   << ImageTypePrefix<T>() << "image2DMSArray g_image_2dms_array;";
		}
		if (subroutine)
		{
			os << NL "subroutine void FuncType(int coord);" NL "subroutine uniform FuncType g_func;";
		}
		if (stage == 0)
		{ // VS
			os << NL "void main() {" NL "  int coord = gl_VertexID;";
		}
		else if (stage == 1)
		{ // TCS
			os << NL "layout(vertices = 1) out;" NL "void main() {" NL "  gl_TessLevelInner[0] = 1;" NL
					 "  gl_TessLevelInner[1] = 1;" NL "  gl_TessLevelOuter[0] = 1;" NL "  gl_TessLevelOuter[1] = 1;" NL
					 "  gl_TessLevelOuter[2] = 1;" NL "  gl_TessLevelOuter[3] = 1;" NL "  int coord = gl_PrimitiveID;";
		}
		else if (stage == 2)
		{ // TES
			os << NL "layout(quads, point_mode) in;" NL "void main() {" NL "  int coord = gl_PrimitiveID;";
		}
		else if (stage == 3)
		{ // GS
			os << NL "layout(points) in;" NL "layout(points, max_vertices = 1) out;" NL "void main() {" NL
					 "  int coord = gl_PrimitiveIDIn;";
		}
		else if (stage == 4)
		{ // CS
			os << NL "layout(local_size_x = 1) in;" NL "void main() {" NL "  int coord = int(gl_GlobalInvocationID.x);";
		}
		else if (stage == 5)
		{ // FS
			os << NL "void main() {" NL "  int coord = gl_PrimitiveID;";
		}
		if (subroutine)
		{
			os << NL "  g_func(coord);" NL "}" NL "subroutine(FuncType) void Func0(int coord) {";
		}
		if (ms_and_1d == false)
		{
			os << NL "  imageStore(g_result, ivec2(coord, 0), ivec4(imageSize(g_image_2d), 0, 0));" NL
					 "  imageStore(g_result, ivec2(coord, 1), ivec4(imageSize(g_image_3d), 0));" NL
					 "  imageStore(g_result, ivec2(coord, 2), ivec4(imageSize(g_image_cube), 0, 0));" NL
					 "  imageStore(g_result, ivec2(coord, 3), ivec4(imageSize(g_image_cube_array), 0));" NL
					 "  imageStore(g_result, ivec2(coord, 4), ivec4(imageSize(g_image_rect), 0, 0));" NL
					 "  imageStore(g_result, ivec2(coord, 5), ivec4(imageSize(g_image_2d_array), 0));" NL
					 "  imageStore(g_result, ivec2(coord, 6), ivec4(imageSize(g_image_buffer), 0, 0, 0));" NL "}";
		}
		else
		{
			os << NL "  imageStore(g_result, ivec2(coord, 0), ivec4(imageSize(g_image_1d), 0, 0, 0));" NL
					 "  imageStore(g_result, ivec2(coord, 1), ivec4(imageSize(g_image_1d_array), 0, 0));" NL
					 "  imageStore(g_result, ivec2(coord, 2), ivec4(imageSize(g_image_2dms), 0, 0));" NL
					 "  imageStore(g_result, ivec2(coord, 3), ivec4(imageSize(g_image_2dms_array), 0));" NL
					 "  imageStore(g_result, ivec2(coord, 4), ivec4(0));" NL
					 "  imageStore(g_result, ivec2(coord, 5), ivec4(0));" NL
					 "  imageStore(g_result, ivec2(coord, 6), ivec4(0));" NL "}";
		}
		return os.str();
	}